

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# draco_options.h
# Opt level: O0

bool __thiscall
draco::DracoOptions<draco::GeometryAttribute::Type>::GetAttributeBool
          (DracoOptions<draco::GeometryAttribute::Type> *this,AttributeKey *att_key,string *name,
          bool default_val)

{
  byte bVar1;
  bool bVar2;
  string *name_00;
  byte in_CL;
  Type *in_RDX;
  DracoOptions<draco::GeometryAttribute::Type> *in_RSI;
  string *in_RDI;
  Options *att_options;
  undefined7 in_stack_ffffffffffffffd8;
  bool local_1;
  
  bVar1 = in_CL & 1;
  name_00 = (string *)FindAttributeOptions(in_RSI,in_RDX);
  if ((name_00 == (string *)0x0) ||
     (bVar2 = Options::IsOptionSet((Options *)name_00,in_RDI), !bVar2)) {
    local_1 = Options::GetBool((Options *)CONCAT17(bVar1,in_stack_ffffffffffffffd8),name_00,
                               SUB81((ulong)in_RDI >> 0x38,0));
  }
  else {
    local_1 = Options::GetBool((Options *)CONCAT17(bVar1,in_stack_ffffffffffffffd8),name_00,
                               SUB81((ulong)in_RDI >> 0x38,0));
  }
  return local_1;
}

Assistant:

bool DracoOptions<AttributeKeyT>::GetAttributeBool(const AttributeKeyT &att_key,
                                                   const std::string &name,
                                                   bool default_val) const {
  const Options *const att_options = FindAttributeOptions(att_key);
  if (att_options && att_options->IsOptionSet(name)) {
    return att_options->GetBool(name, default_val);
  }
  return global_options_.GetBool(name, default_val);
}